

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_ld_mde_a_Test::~CpuTest_ld_mde_a_Test(CpuTest_ld_mde_a_Test *this)

{
  CpuTest_ld_mde_a_Test *this_local;
  
  ~CpuTest_ld_mde_a_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ld_mde_a) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.a = 0xFE;
    regs.d = 0x33;
    regs.e = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.d, regs.e), regs.a));
    execute_instruction(0x12);

    ICpu::Registers expected_regs{};
    expected_regs.a = 0xFE;
    expected_regs.d = 0x33;
    expected_regs.e = 0x44;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}